

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall Args::CmdLine::printInfoAboutUnknownArgument(CmdLine *this,String *word)

{
  anon_class_32_4_d4a081f8 __f;
  Command *pCVar1;
  bool bVar2;
  logic_error *plVar3;
  long *plVar4;
  pointer *ppuVar5;
  size_type *psVar6;
  ulong *puVar7;
  const_iterator __begin3;
  Command *pCVar8;
  String names;
  bool ret;
  StringList correctNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong *local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  anon_class_32_4_d4a081f8 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  iterator local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pointer local_58;
  long lStack_50;
  Command *local_48;
  Command *pCStack_40;
  undefined8 local_38;
  
  local_128.field_2._M_allocated_capacity = (size_type)&local_48;
  local_48 = (Command *)0x0;
  pCStack_40 = (Command *)0x0;
  local_38 = 0;
  local_128.field_2._8_8_ = &local_a8;
  local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffffffffff00;
  __f.name = word;
  __f.this = this;
  __f.possibleNames = (StringList *)local_128.field_2._M_allocated_capacity;
  __f.ret = (bool *)local_128.field_2._8_8_;
  local_128._M_dataplus._M_p = (pointer)this;
  local_128._M_string_length = (size_type)word;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::isMisspelledName(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)const::_lambda(auto:1_const&)_1_>
            (&local_c8,
             (this->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__f);
  pCVar1 = pCStack_40;
  if ((char)local_a8._M_dataplus._M_p == '\x01') {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity =
         local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (local_48 != pCStack_40) {
      bVar2 = true;
      pCVar8 = local_48;
      do {
        if (!bVar2) {
          std::__cxx11::string::append((char *)&local_128);
        }
        std::__cxx11::string::_M_append((char *)&local_128,*(ulong *)pCVar8);
        pCVar8 = pCVar8 + 0x20;
        bVar2 = false;
      } while (pCVar8 != pCVar1);
    }
    plVar3 = (logic_error *)__cxa_allocate_exception(0x30);
    local_88[0]._M_current = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Unknown argument \"","");
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_88,(ulong)(word->_M_dataplus)._M_p);
    local_78.field_2._M_allocated_capacity = *plVar4;
    ppuVar5 = (pointer *)(plVar4 + 2);
    if ((pointer *)local_78.field_2._M_allocated_capacity == ppuVar5) {
      local_58 = *ppuVar5;
      lStack_50 = plVar4[3];
      local_78.field_2._M_allocated_capacity = (size_type)&local_58;
    }
    else {
      local_58 = *ppuVar5;
    }
    local_78.field_2._8_8_ = plVar4[1];
    *plVar4 = (long)ppuVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_78.field_2._M_local_buf);
    local_a8._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_a8._M_dataplus._M_p == psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = plVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
    }
    local_a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   &local_a8,&local_128);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_e8 = (ulong *)*plVar4;
    puVar7 = (ulong *)(plVar4 + 2);
    if (local_e8 == puVar7) {
      local_d8 = *puVar7;
      uStack_d0 = plVar4[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar7;
    }
    local_e0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(plVar3,"Please use desc() method of the exception.");
    *(undefined ***)plVar3 = &PTR__BaseException_00115d28;
    *(logic_error **)(plVar3 + 0x10) = plVar3 + 0x20;
    if (local_e8 == &local_d8) {
      *(undefined4 *)(plVar3 + 0x20) = (undefined4)local_d8;
      *(undefined4 *)(plVar3 + 0x24) = local_d8._4_4_;
      *(undefined4 *)(plVar3 + 0x28) = (undefined4)uStack_d0;
      *(undefined4 *)(plVar3 + 0x2c) = uStack_d0._4_4_;
    }
    else {
      *(ulong **)(plVar3 + 0x10) = local_e8;
      *(ulong *)(plVar3 + 0x20) = local_d8;
    }
    *(long *)(plVar3 + 0x18) = local_e0;
    local_e0 = 0;
    local_d8 = local_d8 & 0xffffffffffffff00;
    local_e8 = &local_d8;
    __cxa_throw(plVar3,&BaseException::typeinfo,BaseException::~BaseException);
  }
  plVar3 = (logic_error *)__cxa_allocate_exception(0x30);
  local_c8.this = (CmdLine *)&local_c8.possibleNames;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Unknown argument \"","");
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c8,(ulong)(word->_M_dataplus)._M_p);
  local_128._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_128._M_dataplus._M_p == psVar6) {
    local_128.field_2._M_allocated_capacity = *psVar6;
    local_128.field_2._8_8_ = plVar4[3];
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar6;
  }
  local_128._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_108 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_108 == puVar7) {
    local_f8 = *puVar7;
    uStack_f0 = plVar4[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar7;
  }
  local_100 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::logic_error::logic_error(plVar3,"Please use desc() method of the exception.");
  *(undefined ***)plVar3 = &PTR__BaseException_00115d28;
  *(logic_error **)(plVar3 + 0x10) = plVar3 + 0x20;
  if (local_108 == &local_f8) {
    *(undefined4 *)(plVar3 + 0x20) = (undefined4)local_f8;
    *(undefined4 *)(plVar3 + 0x24) = local_f8._4_4_;
    *(undefined4 *)(plVar3 + 0x28) = (undefined4)uStack_f0;
    *(undefined4 *)(plVar3 + 0x2c) = uStack_f0._4_4_;
  }
  else {
    *(ulong **)(plVar3 + 0x10) = local_108;
    *(ulong *)(plVar3 + 0x20) = local_f8;
  }
  *(long *)(plVar3 + 0x18) = local_100;
  local_100 = 0;
  local_f8 = local_f8 & 0xffffffffffffff00;
  local_108 = &local_f8;
  __cxa_throw(plVar3,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void printInfoAboutUnknownArgument( const String & word )
	{
		StringList correctNames;

		if( isMisspelledName( word, correctNames ) )
		{
			const String names = details::formatCorrectNamesString(
				correctNames );

			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\".\n\nProbably you mean \"" ) + names +
				SL( "\"." ) );
		}
		else
			throw BaseException( String( SL( "Unknown argument \"" ) ) +
				word + SL( "\"." ) );
	}